

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

void ssh2_write_pubkey(FILE *fp,char *comment,void *v_pub_blob,int pub_len,int keytype)

{
  char *ptr;
  int local_5c;
  char *buffer;
  char local_45;
  int n;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char buf [5];
  int column;
  int i;
  char *p;
  uchar *pub_blob;
  int keytype_local;
  int pub_len_local;
  void *v_pub_blob_local;
  char *comment_local;
  FILE *fp_local;
  
  if (keytype == 9) {
    fprintf((FILE *)fp,"---- BEGIN SSH2 PUBLIC KEY ----\n");
    if (comment != (char *)0x0) {
      fprintf((FILE *)fp,"Comment: \"");
      for (_column = comment; *_column != '\0'; _column = _column + 1) {
        if ((*_column == '\\') || (*_column == '\"')) {
          fputc(0x5c,(FILE *)fp);
        }
        fputc((int)*_column,(FILE *)fp);
      }
      fprintf((FILE *)fp,"\"\n");
    }
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    cStack_40 = '\0';
    cStack_3f = '\0';
    cStack_3e = '\0';
    buf[0] = '\0';
    while ((int)buf._1_4_ < pub_len) {
      if (pub_len - buf._1_4_ < 3) {
        local_5c = pub_len - buf._1_4_;
      }
      else {
        local_5c = 3;
      }
      base64_encode_atom((uchar *)((long)v_pub_blob + (long)(int)buf._1_4_),local_5c,&local_45);
      buf._1_4_ = local_5c + buf._1_4_;
      n._3_1_ = 0;
      fputs(&local_45,(FILE *)fp);
      _cStack_40 = _cStack_40 + 1;
      if (0xf < _cStack_40) {
        fputc(10,(FILE *)fp);
        cStack_40 = '\0';
        cStack_3f = '\0';
        cStack_3e = '\0';
        buf[0] = '\0';
      }
    }
    if (0 < _cStack_40) {
      fputc(10,(FILE *)fp);
    }
    fprintf((FILE *)fp,"---- END SSH2 PUBLIC KEY ----\n");
  }
  else {
    if (keytype != 10) {
      __assert_fail("false && \"Bad key type in ssh2_write_pubkey\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x6b6,"void ssh2_write_pubkey(FILE *, const char *, const void *, int, int)");
    }
    ptr = ssh2_pubkey_openssh_str_internal(comment,v_pub_blob,pub_len);
    fprintf((FILE *)fp,"%s\n",ptr);
    safefree(ptr);
  }
  return;
}

Assistant:

void ssh2_write_pubkey(FILE *fp, const char *comment,
                       const void *v_pub_blob, int pub_len,
                       int keytype)
{
    unsigned char *pub_blob = (unsigned char *)v_pub_blob;

    if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716) {
        const char *p;
        int i, column;

        fprintf(fp, "---- BEGIN SSH2 PUBLIC KEY ----\n");

        if (comment) {
            fprintf(fp, "Comment: \"");
            for (p = comment; *p; p++) {
                if (*p == '\\' || *p == '\"')
                    fputc('\\', fp);
                fputc(*p, fp);
            }
            fprintf(fp, "\"\n");
        }

        i = 0;
        column = 0;
        while (i < pub_len) {
            char buf[5];
            int n = (pub_len - i < 3 ? pub_len - i : 3);
            base64_encode_atom(pub_blob + i, n, buf);
            i += n;
            buf[4] = '\0';
            fputs(buf, fp);
            if (++column >= 16) {
                fputc('\n', fp);
                column = 0;
            }
        }
        if (column > 0)
            fputc('\n', fp);

        fprintf(fp, "---- END SSH2 PUBLIC KEY ----\n");
    } else if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
        char *buffer = ssh2_pubkey_openssh_str_internal(comment,
                                                        v_pub_blob, pub_len);
        fprintf(fp, "%s\n", buffer);
        sfree(buffer);
    } else {
        unreachable("Bad key type in ssh2_write_pubkey");
    }
}